

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O2

void __thiscall Indexer::make_spill(Indexer *this,DatasetBuilder *builder)

{
  DatabaseSnapshot *pDVar1;
  pointer ppOVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  pointer ppOVar3;
  pointer pcVar4;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view_t fmt_01;
  allocator<char> local_151;
  DatasetBuilder *local_150;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> candidates;
  string merged_name;
  string dataset_name;
  string local_f0;
  undefined1 local_d0 [160];
  
  pDVar1 = this->snap;
  local_150 = builder;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&merged_name,"set",(allocator<char> *)&local_f0);
  DatabaseSnapshot::allocate_name((DatabaseName *)local_d0,pDVar1,&merged_name);
  std::__cxx11::string::string((string *)&dataset_name,(string *)(local_d0 + 0x80));
  DatabaseName::~DatabaseName((DatabaseName *)local_d0);
  std::__cxx11::string::~string((string *)&merged_name);
  fmt.size_ = (size_t)&dataset_name;
  fmt.data_ = (char *)0xf;
  spdlog::debug<std::__cxx11::string>((spdlog *)"New dataset: {}",fmt,in_RCX);
  DatasetBuilder::save(local_150,&this->snap->db_base,&dataset_name);
  register_dataset(this,&dataset_name);
  do {
    created_dataset_ptrs
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)local_d0,
               this);
    OnDiskDataset::get_compact_candidates
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
               &candidates.
                super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,
               (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)local_d0);
    std::_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~_Vector_base
              ((_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
               local_d0);
    pcVar4 = (pointer)((long)candidates.
                             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)candidates.
                             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
    local_d0._0_8_ = pcVar4;
    if (pcVar4 < (pointer)0x14) {
      fmt_00.size_ = (size_t)local_d0;
      fmt_00.data_ = (char *)0x18;
      spdlog::debug<unsigned_long>
                ((spdlog *)"{} datasets, not merging",fmt_00,(unsigned_long *)in_RCX);
    }
    else {
      fmt_01.size_ = (size_t)local_d0;
      fmt_01.data_ = (char *)0x13;
      spdlog::debug<unsigned_long>((spdlog *)"Merging {} datasets",fmt_01,(unsigned_long *)in_RCX);
      pDVar1 = this->snap;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"set",&local_151);
      DatabaseSnapshot::allocate_name((DatabaseName *)local_d0,pDVar1,&local_f0);
      std::__cxx11::string::string((string *)&merged_name,(string *)(local_d0 + 0x80));
      DatabaseName::~DatabaseName((DatabaseName *)local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      OnDiskDataset::merge
                (&this->snap->db_base,&merged_name,
                 (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                 &candidates.
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,
                 (TaskSpec *)0x0);
      ppOVar2 = candidates.
                super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppOVar3 = candidates.
                     super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppOVar3 != ppOVar2;
          ppOVar3 = ppOVar3 + 1) {
        remove_dataset(this,*ppOVar3);
      }
      register_dataset(this,&merged_name);
      std::__cxx11::string::~string((string *)&merged_name);
    }
    std::_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~_Vector_base
              (&candidates.
                super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>);
  } while ((pointer)0x13 < pcVar4);
  DatasetBuilder::clear(local_150);
  std::__cxx11::string::~string((string *)&dataset_name);
  return;
}

Assistant:

void Indexer::make_spill(DatasetBuilder &builder) {
    auto dataset_name = snap->allocate_name().get_filename();
    spdlog::debug("New dataset: {}", dataset_name);
    builder.save(snap->db_base, dataset_name);
    register_dataset(dataset_name);
    bool stop = false;

    while (!stop) {
        std::vector<const OnDiskDataset *> candidates =
            OnDiskDataset::get_compact_candidates(created_dataset_ptrs());

        if (candidates.size() >= INDEXER_COMPACT_THRESHOLD) {
            spdlog::debug("Merging {} datasets", candidates.size());
            std::string merged_name = snap->allocate_name().get_filename();
            OnDiskDataset::merge(snap->db_base, merged_name, candidates,
                                 nullptr);
            for (const auto *ds : candidates) {
                remove_dataset(ds);
            }
            register_dataset(merged_name);
        } else {
            spdlog::debug("{} datasets, not merging", candidates.size());
            stop = true;
        }
    }

    builder.clear();
}